

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# joystickmenu.cpp
# Opt level: O0

void __thiscall FOptionMenuItemJoyMap::SetSelection(FOptionMenuItemJoyMap *this,int selection)

{
  uint uVar1;
  uint uVar2;
  Pair *pPVar3;
  FName local_24;
  FOptionValues **local_20;
  FOptionValues **opt;
  FOptionMenuItemJoyMap *pFStack_10;
  int selection_local;
  FOptionMenuItemJoyMap *this_local;
  
  opt._4_4_ = selection;
  pFStack_10 = this;
  FName::FName(&local_24,
               (FName *)&(this->super_FOptionMenuItemOptionBase).super_FOptionMenuItem.field_0x24);
  local_20 = TMap<FName,_FOptionValues_*,_THashTraits<FName>,_TValueTraits<FOptionValues_*>_>::
             CheckKey(&OptionValues,&local_24);
  uVar1 = opt._4_4_;
  if ((local_20 != (FOptionValues **)0x0) && (*local_20 != (FOptionValues *)0x0)) {
    uVar2 = TArray<FOptionValues::Pair,_FOptionValues::Pair>::Size(&(*local_20)->mValues);
    if (uVar1 < uVar2) {
      pPVar3 = TArray<FOptionValues::Pair,_FOptionValues::Pair>::operator[]
                         (&(*local_20)->mValues,(long)(int)opt._4_4_);
      opt._4_4_ = (uint)pPVar3->Value;
      goto LAB_003d7ed4;
    }
  }
  opt._4_4_ = 0xffffffff;
LAB_003d7ed4:
  (*SELECTED_JOYSTICK->_vptr_IJoystickConfig[0xb])
            (SELECTED_JOYSTICK,(ulong)*(uint *)&(this->super_FOptionMenuItemOptionBase).field_0x34,
             (ulong)opt._4_4_);
  return;
}

Assistant:

void SetSelection(int selection)
	{
		FOptionValues **opt = OptionValues.CheckKey(mValues);
		// Map from menu selection to joystick axis.
		if (opt == NULL || *opt == NULL || (unsigned)selection >= (*opt)->mValues.Size())
		{
			selection = JOYAXIS_None;
		}
		else
		{
			selection = (int)(*opt)->mValues[selection].Value;
		}
		SELECTED_JOYSTICK->SetAxisMap(mAxis, (EJoyAxis)selection);
	}